

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

void delete_compilation_unit(Context_conflict *ctx,MOJOSHADER_astCompilationUnit *unit)

{
  MOJOSHADER_astCompilationUnit *unit_00;
  MOJOSHADER_astCompilationUnit *pMVar1;
  void *pvVar2;
  
  if (unit != (MOJOSHADER_astCompilationUnit *)0x0) {
    unit_00 = unit->next;
    unit->next = (MOJOSHADER_astCompilationUnit *)0x0;
    while (unit_00 != (MOJOSHADER_astCompilationUnit *)0x0) {
      pMVar1 = unit_00->next;
      unit_00->next = (MOJOSHADER_astCompilationUnit *)0x0;
      delete_compilation_unit(ctx,unit_00);
      unit_00 = pMVar1;
    }
    switch((unit->ast).type) {
    case MOJOSHADER_AST_COMPUNIT_FUNCTION:
      delete_compilation_unit(ctx,unit->next);
      pvVar2 = *(void **)&unit[1].ast;
      if (pvVar2 != (void *)0x0) {
        delete_function_params(ctx,*(MOJOSHADER_astFunctionParameters **)((long)pvVar2 + 0x28));
        (*ctx->free)(pvVar2,ctx->malloc_data);
      }
      delete_statement(ctx,(MOJOSHADER_astStatement *)unit[1].ast.filename);
      break;
    case MOJOSHADER_AST_COMPUNIT_TYPEDEF:
      delete_compilation_unit(ctx,unit->next);
      delete_typedef(ctx,*(MOJOSHADER_astTypedef **)&unit[1].ast);
      break;
    case MOJOSHADER_AST_COMPUNIT_STRUCT:
      delete_compilation_unit(ctx,unit->next);
      pvVar2 = *(void **)&unit[1].ast;
      if (pvVar2 != (void *)0x0) {
        delete_struct_member(ctx,*(MOJOSHADER_astStructMembers **)((long)pvVar2 + 0x28));
        (*ctx->free)(pvVar2,ctx->malloc_data);
      }
      break;
    case MOJOSHADER_AST_COMPUNIT_VARIABLE:
      delete_compilation_unit(ctx,unit->next);
      delete_variable_declaration(ctx,*(MOJOSHADER_astVariableDeclaration **)&unit[1].ast);
      break;
    default:
      __assert_fail("0 && \"missing cleanup code\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x477,
                    "void delete_compilation_unit(Context *, MOJOSHADER_astCompilationUnit *)");
    }
    (*ctx->free)(unit,ctx->malloc_data);
    return;
  }
  return;
}

Assistant:

static void delete_compilation_unit(Context *ctx,
                                    MOJOSHADER_astCompilationUnit *unit)
{
    if (!unit) return;

    // it's important to not recurse too deeply here, since you may have
    //  thousands of items in this linked list (each line of a massive
    //  function, for example). To avoid this, we iterate the list here,
    //  deleting all children and making them think they have no reason
    //  to recurse in their own delete methods.
    // Please note that everyone should _try_ to delete their "next" member,
    //  just in case, but hopefully this cleaned it out.

    MOJOSHADER_astCompilationUnit *i = unit->next;
    unit->next = NULL;
    while (i)
    {
        MOJOSHADER_astCompilationUnit *next = i->next;
        i->next = NULL;
        delete_compilation_unit(ctx, i);
        i = next;
    } // while

    switch (unit->ast.type)
    {
        #define DELETE_UNIT(typ, cls, fn) \
            case MOJOSHADER_AST_COMPUNIT_##typ: delete_##fn(ctx, (cls *) unit); break;
        DELETE_UNIT(FUNCTION, MOJOSHADER_astCompilationUnitFunction, function);
        DELETE_UNIT(TYPEDEF, MOJOSHADER_astCompilationUnitTypedef, global_typedef);
        DELETE_UNIT(VARIABLE, MOJOSHADER_astCompilationUnitVariable, global_variable);
        DELETE_UNIT(STRUCT, MOJOSHADER_astCompilationUnitStruct, global_struct);
        #undef DELETE_UNIT
        default: assert(0 && "missing cleanup code"); break;
    } // switch

    // don't free (unit) here, the class-specific functions do it.
}